

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  FKey *pFVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  VTable *pVVar5;
  code *in_RCX;
  Module *in_RDX;
  Table *in_RSI;
  sqlite3 *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  int nDel;
  int j;
  int i;
  int nType;
  char *zType;
  u16 oooHidden;
  int iCol;
  char *zFormat;
  VtabCtx *pCtx;
  int iDb;
  char *zModuleName;
  int nArg;
  char **azArg;
  int rc;
  VTable *pVTable;
  char *zErr;
  VtabCtx sCtx;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  ushort local_a6;
  int local_a4;
  VtabCtx *local_98;
  int local_6c;
  int local_34;
  long local_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar3 = (in_RSI->u).tab.addColOffset;
  local_30 = 0;
  pFVar1 = (in_RSI->u).tab.pFKey;
  local_98 = in_RDI->pVtabCtx;
  do {
    if (local_98 == (VtabCtx *)0x0) {
      pcVar4 = sqlite3DbStrDup((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                               (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                              );
      if (pcVar4 == (char *)0x0) {
        local_34 = 7;
      }
      else {
        pVVar5 = (VTable *)
                 sqlite3MallocZero(CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (pVVar5 == (VTable *)0x0) {
          sqlite3OomFault((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          local_34 = 7;
        }
        else {
          pVVar5->db = in_RDI;
          pVVar5->pMod = in_RDX;
          pVVar5->eVtabRisk = '\x01';
          iVar2 = sqlite3SchemaToIndex(in_RDI,in_RSI->pSchema);
          ((in_RSI->u).tab.pFKey)->pNextFrom = (FKey *)in_RDI->aDb[iVar2].zDbSName;
          local_28._16_8_ = in_RDI->pVtabCtx;
          local_28._24_8_ = local_28._24_8_ & 0xffffffff00000000;
          in_RDI->pVtabCtx = (VtabCtx *)local_28;
          in_RSI->nTabRef = in_RSI->nTabRef + 1;
          local_28._0_8_ = pVVar5;
          local_28._8_8_ = in_RSI;
          local_6c = (*in_RCX)(in_RDI,in_RDX->pAux,iVar3,pFVar1,&pVVar5->pVtab,&local_30);
          sqlite3DeleteTable((sqlite3 *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (Table *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
          ;
          in_RDI->pVtabCtx = (VtabCtx *)local_28._16_8_;
          if (local_6c == 7) {
            sqlite3OomFault((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                           );
          }
          if (local_6c == 0) {
            if (pVVar5->pVtab != (sqlite3_vtab *)0x0) {
              memset(pVVar5->pVtab,0,0x18);
              pVVar5->pVtab->pModule = in_RDX->pModule;
              in_RDX->nRefModule = in_RDX->nRefModule + 1;
              pVVar5->nRef = 1;
              if (local_28._24_4_ == 0) {
                pcVar4 = sqlite3MPrintf(in_RDI,"vtable constructor did not declare schema: %s",
                                        pcVar4);
                *in_R8 = pcVar4;
                sqlite3VtabUnlock((VTable *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
                local_6c = 1;
              }
              else {
                local_a6 = 0;
                pVVar5->pNext = (VTable *)(in_RSI->u).tab.pDfltList;
                (in_RSI->u).vtab.p = pVVar5;
                for (local_a4 = 0; local_a4 < in_RSI->nCol; local_a4 = local_a4 + 1) {
                  pcVar4 = sqlite3ColumnType((Column *)
                                             CONCAT44(in_stack_ffffffffffffff4c,
                                                      in_stack_ffffffffffffff48),
                                             (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                              in_stack_ffffffffffffff40));
                  in_stack_ffffffffffffff4c =
                       sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                        in_stack_ffffffffffffff38));
                  in_stack_ffffffffffffff48 = 0;
                  while ((in_stack_ffffffffffffff48 < in_stack_ffffffffffffff4c &&
                         (((iVar3 = sqlite3_strnicmp("hidden",pcVar4 + in_stack_ffffffffffffff48,6),
                           iVar3 != 0 ||
                           ((in_stack_ffffffffffffff48 != 0 &&
                            (pcVar4[in_stack_ffffffffffffff48 + -1] != ' ')))) ||
                          ((pcVar4[in_stack_ffffffffffffff48 + 6] != '\0' &&
                           (pcVar4[in_stack_ffffffffffffff48 + 6] != ' '))))))) {
                    in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 + 1;
                  }
                  if (in_stack_ffffffffffffff48 < in_stack_ffffffffffffff4c) {
                    in_stack_ffffffffffffff40 = (pcVar4[in_stack_ffffffffffffff48 + 6] != '\0') + 6;
                    for (in_stack_ffffffffffffff44 = in_stack_ffffffffffffff48;
                        in_stack_ffffffffffffff44 + in_stack_ffffffffffffff40 <=
                        in_stack_ffffffffffffff4c;
                        in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1) {
                      pcVar4[in_stack_ffffffffffffff44] =
                           pcVar4[in_stack_ffffffffffffff44 + in_stack_ffffffffffffff40];
                    }
                    if ((pcVar4[in_stack_ffffffffffffff48] == '\0') &&
                       (0 < in_stack_ffffffffffffff48)) {
                      pcVar4[in_stack_ffffffffffffff48 + -1] = '\0';
                    }
                    in_RSI->aCol[local_a4].colFlags = in_RSI->aCol[local_a4].colFlags | 2;
                    in_RSI->tabFlags = in_RSI->tabFlags | 2;
                    local_a6 = 0x400;
                  }
                  else {
                    in_RSI->tabFlags = (uint)local_a6 | in_RSI->tabFlags;
                  }
                }
              }
            }
          }
          else {
            if (local_30 == 0) {
              pcVar4 = sqlite3MPrintf(in_RDI,"vtable constructor failed: %s",pcVar4);
              *in_R8 = pcVar4;
            }
            else {
              pcVar4 = sqlite3MPrintf(in_RDI,"%s",local_30);
              *in_R8 = pcVar4;
              sqlite3_free((void *)0x1a1714);
            }
            sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          }
          sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          local_34 = local_6c;
        }
      }
LAB_001a1a3c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_34;
      }
      __stack_chk_fail();
    }
    if (local_98->pTab == in_RSI) {
      pcVar4 = sqlite3MPrintf(in_RDI,"vtable constructor called recursively: %s",in_RSI->zName);
      *in_R8 = pcVar4;
      local_34 = 6;
      goto LAB_001a1a3c;
    }
    local_98 = local_98->pPrior;
  } while( true );
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db,
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg;
  int nArg = pTab->u.vtab.nArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  assert( IsVirtual(pTab) );
  azArg = (const char *const*)pTab->u.vtab.azArg;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db,
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;
  pVTable->eVtabRisk = SQLITE_VTABRISK_Normal;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->u.vtab.azArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  pTab->nTabRef++;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  assert( pTab!=0 );
  assert( pTab->nTabRef>1 || rc!=SQLITE_OK );
  sqlite3DeleteTable(db, pTab);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pMod->nRefModule++;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, zModuleName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u16 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->u.vtab.p. Then loop through the
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->u.vtab.p;
      pTab->u.vtab.p = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          pTab->tabFlags |= TF_HasHidden;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}